

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::AmrLevel::checkPoint(AmrLevel *this,string *dir,ostream *os,How how,bool dump_old)

{
  bool bVar1;
  ostream *poVar2;
  void *in_RDX;
  Real in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  string *unaff_retaddr;
  string *in_stack_00000008;
  StateData *in_stack_00000010;
  ostream *in_stack_00000030;
  BoxArray *in_stack_00000038;
  string FullPathName;
  string PathNameInHdr;
  string FullPath;
  string LevelDir;
  int i;
  int ndesc;
  size_type in_stack_fffffffffffffe98;
  ostream *in_stack_fffffffffffffea0;
  allocator *in_stack_fffffffffffffec0;
  Geometry *g;
  ostream *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  AmrLevel *in_stack_ffffffffffffff10;
  string local_e0 [32];
  string local_c0 [39];
  allocator local_99;
  string local_98;
  undefined1 local_68 [64];
  int local_28;
  int local_24;
  byte local_1d;
  void *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *os_00;
  
  local_1d = in_R8B & 1;
  local_18 = in_RDX;
  os_00 = in_RDI;
  local_24 = DescriptorList::size((DescriptorList *)0x1396c4b);
  std::__cxx11::string::string((string *)(local_68 + 0x20));
  g = (Geometry *)local_68;
  std::__cxx11::string::string((string *)g);
  LevelDirectoryNames(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8);
  if ((in_RDI[0x10].field_2._M_local_buf[0] & 1U) == 0) {
    (**(code **)(*(long *)in_RDI + 0x10))(in_RDI,in_RSI);
    in_stack_fffffffffffffec0 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"AmrLevel::checkPoint::dir",in_stack_fffffffffffffec0);
    ParallelDescriptor::Barrier(&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    poVar2 = (ostream *)std::ostream::operator<<(local_18,(int)in_RDI->_M_string_length);
    std::operator<<(poVar2,'\n');
    poVar2 = amrex::operator<<(in_stack_fffffffffffffee0,g);
    std::operator<<(poVar2,'\n');
    BoxArray::writeOn(in_stack_00000038,in_stack_00000030);
    in_stack_fffffffffffffea0 = (ostream *)std::ostream::operator<<(local_18,local_24);
    std::operator<<(in_stack_fffffffffffffea0,'\n');
  }
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    std::operator+(in_RDI,(char *)in_stack_fffffffffffffec0);
    Concatenate((string *)FullPathName.field_2._M_allocated_capacity,
                FullPathName._M_string_length._4_4_,(int)FullPathName._M_string_length);
    std::__cxx11::string::~string(local_e0);
    std::operator+(in_RDI,(char *)in_stack_fffffffffffffec0);
    Concatenate((string *)FullPathName.field_2._M_allocated_capacity,
                FullPathName._M_string_length._4_4_,(int)FullPathName._M_string_length);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    StateData::checkPoint
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,(ostream *)os_00,
               (How)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    std::__cxx11::string::~string(local_c0);
  }
  in_RDI[0x10].field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  return;
}

Assistant:

void
AmrLevel::checkPoint (const std::string& dir,
                      std::ostream&      os,
                      VisMF::How         how,
                      bool               dump_old)
{
    BL_PROFILE("AmrLevel::checkPoint()");
    int ndesc = desc_lst.size(), i;
    //
    // Build directory to hold the MultiFabs in the StateData at this level.
    // The directory is relative the the directory containing the Header file.
    //
    std::string LevelDir, FullPath;
    LevelDirectoryNames(dir, LevelDir, FullPath);
    if( ! levelDirectoryCreated) {
      CreateLevelDirectory(dir);
      // ---- Force other processors to wait until directory is built.
      ParallelDescriptor::Barrier("AmrLevel::checkPoint::dir");
    }

    if (ParallelDescriptor::IOProcessor())
    {
        os << level << '\n' << geom  << '\n';
        grids.writeOn(os);
        os << ndesc << '\n';
    }
    //
    // Output state data.
    //

    for (i = 0; i < ndesc; i++)
    {
        //
        // Now build the full relative pathname of the StateData.
        // The name is relative to the Header file containing this name.
        // It's the name that gets written into the Header.
        //
        std::string PathNameInHdr = amrex::Concatenate(LevelDir + "/SD_", i, 1);
        std::string FullPathName  = amrex::Concatenate(FullPath + "/SD_", i, 1);

        state[i].checkPoint(PathNameInHdr, FullPathName, os, how, dump_old);
    }

    levelDirectoryCreated = false;  // ---- now that the checkpoint is finished
}